

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vepu541_common.c
# Opt level: O0

MPP_RET copy2osd2(MppEncOSDData2 *dst,MppEncOSDData *src1,MppEncOSDData2 *src2)

{
  uint local_28;
  MPP_RET local_24;
  RK_U32 i;
  MPP_RET ret;
  MppEncOSDData2 *src2_local;
  MppEncOSDData *src1_local;
  MppEncOSDData2 *dst_local;
  
  if (src1 == (MppEncOSDData *)0x0) {
    if (src2 == (MppEncOSDData2 *)0x0) {
      local_24 = MPP_NOK;
    }
    else {
      memcpy(dst,src2,0x148);
      local_24 = MPP_OK;
    }
  }
  else {
    dst->num_region = src1->num_region;
    for (local_28 = 0; local_28 < src1->num_region; local_28 = local_28 + 1) {
      dst->region[local_28].enable = src1->region[local_28].enable;
      dst->region[local_28].inverse = src1->region[local_28].inverse;
      dst->region[local_28].start_mb_x = src1->region[local_28].start_mb_x;
      dst->region[local_28].start_mb_y = src1->region[local_28].start_mb_y;
      dst->region[local_28].num_mb_x = src1->region[local_28].num_mb_x;
      dst->region[local_28].num_mb_y = src1->region[local_28].num_mb_y;
      dst->region[local_28].buf_offset = src1->region[local_28].buf_offset;
      dst->region[local_28].buf = src1->buf;
    }
    local_24 = MPP_OK;
  }
  return local_24;
}

Assistant:

static MPP_RET copy2osd2(MppEncOSDData2* dst, MppEncOSDData *src1, MppEncOSDData2 *src2)
{
    MPP_RET ret = MPP_OK;
    RK_U32 i = 0;

    if (src1) {
        dst->num_region = src1->num_region;
        for (i = 0; i < src1->num_region; i++) {
            dst->region[i].enable       = src1->region[i].enable;
            dst->region[i].inverse      = src1->region[i].inverse;
            dst->region[i].start_mb_x   = src1->region[i].start_mb_x;
            dst->region[i].start_mb_y   = src1->region[i].start_mb_y;
            dst->region[i].num_mb_x     = src1->region[i].num_mb_x;
            dst->region[i].num_mb_y     = src1->region[i].num_mb_y;
            dst->region[i].buf_offset   = src1->region[i].buf_offset;
            dst->region[i].buf          = src1->buf;
        }
        ret = MPP_OK;
    } else if (src2) {
        memcpy(dst, src2, sizeof(MppEncOSDData2));
        ret = MPP_OK;
    } else {
        ret = MPP_NOK;
    }
    return ret;
}